

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O2

void ImageDrawCircle(Image *dst,int centerX,int centerY,int radius,Color color)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined4 local_78;
  
  iVar2 = radius * -2 + 3;
  local_78 = radius * 4 + -8;
  iVar1 = 0;
  do {
    iVar5 = -iVar1;
    iVar3 = iVar1 << 2;
    iVar4 = iVar1;
    while( true ) {
      iVar1 = iVar4 + 1;
      if (radius < iVar4) {
        return;
      }
      iVar4 = centerX + iVar1 + -1;
      ImageDrawPixel(dst,iVar4,radius + centerY,color);
      ImageDrawPixel(dst,centerX + iVar5,radius + centerY,color);
      ImageDrawPixel(dst,iVar4,centerY - radius,color);
      ImageDrawPixel(dst,centerX + iVar5,centerY - radius,color);
      iVar4 = centerY + iVar1 + -1;
      ImageDrawPixel(dst,radius + centerX,iVar4,color);
      ImageDrawPixel(dst,centerX - radius,iVar4,color);
      ImageDrawPixel(dst,radius + centerX,centerY + iVar5,color);
      ImageDrawPixel(dst,centerX - radius,centerY + iVar5,color);
      if (0 < iVar2) break;
      iVar2 = iVar2 + iVar3 + 10;
      iVar5 = iVar5 + -1;
      iVar3 = iVar3 + 4;
      iVar4 = iVar1;
    }
    radius = radius + -1;
    iVar2 = iVar2 + (iVar3 - local_78) + 10;
    local_78 = local_78 + -4;
  } while( true );
}

Assistant:

void ImageDrawCircle(Image *dst, int centerX, int centerY, int radius, Color color)
{
    int x = 0, y = radius;
    int decesionParameter = 3 - 2*radius;

    while (y >= x)
    {
        ImageDrawPixel(dst, centerX + x, centerY + y, color);
        ImageDrawPixel(dst, centerX - x, centerY + y, color);
        ImageDrawPixel(dst, centerX + x, centerY - y, color);
        ImageDrawPixel(dst, centerX - x, centerY - y, color);
        ImageDrawPixel(dst, centerX + y, centerY + x, color);
        ImageDrawPixel(dst, centerX - y, centerY + x, color);
        ImageDrawPixel(dst, centerX + y, centerY - x, color);
        ImageDrawPixel(dst, centerX - y, centerY - x, color);
        x++;

        if (decesionParameter > 0)
        {
            y--;
            decesionParameter = decesionParameter + 4*(x - y) + 10;
        }
        else decesionParameter = decesionParameter + 4*x + 6;
    }
}